

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O0

int mqtt_codec_bytesReceived(MQTTCODEC_HANDLE handle,uchar *buffer,size_t size)

{
  uint8_t remainLen;
  CONTROL_PACKET_TYPE CVar1;
  int iVar2;
  uchar *puVar3;
  size_t sVar4;
  size_t totalLen;
  uint8_t *dataBytes;
  ulong uStack_38;
  uint8_t iterator;
  size_t index;
  MQTTCODEC_INSTANCE *codec_Data;
  int result;
  size_t size_local;
  uchar *buffer_local;
  MQTTCODEC_HANDLE handle_local;
  
  if (handle == (MQTTCODEC_HANDLE)0x0) {
    codec_Data._4_4_ = 0x425;
  }
  else if ((buffer == (uchar *)0x0) || (size == 0)) {
    handle->currPacket = PACKET_TYPE_ERROR;
    codec_Data._4_4_ = 0x42c;
  }
  else {
    codec_Data._4_4_ = 0;
    for (uStack_38 = 0; uStack_38 < size && codec_Data._4_4_ == 0; uStack_38 = uStack_38 + 1) {
      remainLen = buffer[uStack_38];
      if (handle->codecState == CODEC_STATE_FIXED_HEADER) {
        if (handle->currPacket == UNKNOWN_TYPE) {
          CVar1 = processControlPacketType(remainLen,&handle->headerFlags);
          handle->currPacket = CVar1;
          CVar1 = handle->currPacket;
          if (CVar1 != CONTROL_PACKET_TYPE_INVALID) {
            if (CVar1 == PACKET_INVALID1_TYPE) {
LAB_0018a7f0:
              handle->currPacket = PACKET_TYPE_ERROR;
              codec_Data._4_4_ = 0x442;
            }
            else {
              if ((CVar1 != CONNECT_TYPE) && (CVar1 != CONNACK_TYPE)) {
                if (CVar1 == PUBLISH_TYPE) goto LAB_0018a96a;
                if ((CVar1 != PUBACK_TYPE) && (CVar1 != PUBREC_TYPE)) {
                  if (CVar1 == PUBREL_TYPE) {
LAB_0018a825:
                    if ((handle->headerFlags & 0xfU) != 2) {
                      handle->currPacket = PACKET_TYPE_ERROR;
                      codec_Data._4_4_ = 0x45c;
                    }
                    goto LAB_0018a96a;
                  }
                  if (CVar1 != PUBCOMP_TYPE) {
                    if (CVar1 == SUBSCRIBE_TYPE) goto LAB_0018a825;
                    if (CVar1 != SUBACK_TYPE) {
                      if (CVar1 == UNSUBSCRIBE_TYPE) goto LAB_0018a825;
                      if ((((CVar1 != UNSUBACK_TYPE) && (CVar1 != PINGREQ_TYPE)) &&
                          (CVar1 != PINGRESP_TYPE)) && (CVar1 != DISCONNECT_TYPE)) {
                        if ((1 < (uint)(CVar1 + ~DISCONNECT_TYPE)) &&
                           (CVar1 == PACKET_INVALID2_TYPE)) goto LAB_0018a7f0;
                        goto LAB_0018a96a;
                      }
                    }
                  }
                }
              }
              if ((handle->headerFlags & 0xfU) != 0) {
                handle->currPacket = PACKET_TYPE_ERROR;
                codec_Data._4_4_ = 0x452;
              }
            }
          }
        }
        else {
          iVar2 = prepareheaderDataInfo(handle,remainLen);
          if (iVar2 == 0) {
            if (handle->currPacket == PINGRESP_TYPE) {
              if (buffer[uStack_38] == '\0') {
                completePacketData(handle);
              }
              else {
                handle->currPacket = PACKET_TYPE_ERROR;
                codec_Data._4_4_ = 0x47a;
              }
            }
          }
          else {
            handle->currPacket = PACKET_TYPE_ERROR;
            codec_Data._4_4_ = 0x46d;
          }
        }
      }
      else if (handle->codecState == CODEC_STATE_VAR_HEADER) {
        if (handle->headerData == (BUFFER_HANDLE)0x0) {
          handle->codecState = CODEC_STATE_PAYLOAD;
        }
        else {
          puVar3 = BUFFER_u_char(handle->headerData);
          if (puVar3 == (uchar *)0x0) {
            handle->currPacket = PACKET_TYPE_ERROR;
            codec_Data._4_4_ = 0x48c;
          }
          else {
            sVar4 = handle->bufferOffset;
            handle->bufferOffset = sVar4 + 1;
            puVar3[sVar4] = remainLen;
            sVar4 = BUFFER_length(handle->headerData);
            if (sVar4 <= handle->bufferOffset) {
              completePacketData(handle);
            }
          }
        }
      }
      else {
        handle->currPacket = PACKET_TYPE_ERROR;
        codec_Data._4_4_ = 0x4a1;
      }
LAB_0018a96a:
    }
  }
  return codec_Data._4_4_;
}

Assistant:

int mqtt_codec_bytesReceived(MQTTCODEC_HANDLE handle, const unsigned char* buffer, size_t size)
{
    int result;
    MQTTCODEC_INSTANCE* codec_Data = (MQTTCODEC_INSTANCE*)handle;
    /* Codes_SRS_MQTT_CODEC_07_031: [If the parameters handle or buffer is NULL then mqtt_codec_bytesReceived shall return a non-zero value.] */
    if (codec_Data == NULL)
    {
        result = MU_FAILURE;
    }
    /* Codes_SRS_MQTT_CODEC_07_031: [If the parameters handle or buffer is NULL then mqtt_codec_bytesReceived shall return a non-zero value.] */
    /* Codes_SRS_MQTT_CODEC_07_032: [If the parameters size is zero then mqtt_codec_bytesReceived shall return a non-zero value.] */
    else if (buffer == NULL || size == 0)
    {
        codec_Data->currPacket = PACKET_TYPE_ERROR;
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_MQTT_CODEC_07_033: [mqtt_codec_bytesReceived constructs a sequence of bytes into the corresponding MQTT packets and on success returns zero.] */
        result = 0;
        size_t index = 0;
        for (index = 0; index < size && result == 0; index++)
        {
            uint8_t iterator = ((int8_t*)buffer)[index];
            if (codec_Data->codecState == CODEC_STATE_FIXED_HEADER)
            {
                if (codec_Data->currPacket == UNKNOWN_TYPE)
                {
                    codec_Data->currPacket = processControlPacketType(iterator, &codec_Data->headerFlags);

                    // validate packet type and invalid reserved header flags
                    switch (codec_Data->currPacket)
                    {
                        case PACKET_INVALID1_TYPE:
                        case PACKET_INVALID2_TYPE:
                            codec_Data->currPacket = PACKET_TYPE_ERROR;
                            result = MU_FAILURE;
                            break;

                        case CONNECT_TYPE:
                        case CONNACK_TYPE:
                        case PUBACK_TYPE:
                        case PUBREC_TYPE:
                        case PUBCOMP_TYPE:
                        case SUBACK_TYPE:
                        case UNSUBACK_TYPE:
                        case PINGREQ_TYPE:
                        case PINGRESP_TYPE:
                        case DISCONNECT_TYPE:
                            if (codec_Data->headerFlags & 0x0F) // flags must be all zeros
                            {
                                codec_Data->currPacket = PACKET_TYPE_ERROR;
                                result = MU_FAILURE;
                            }
                            break;

                        case PUBREL_TYPE:
                        case SUBSCRIBE_TYPE:
                        case UNSUBSCRIBE_TYPE:
                            if ((codec_Data->headerFlags & 0x0F) != 0x02) // only bit 1 must be set
                            {
                                codec_Data->currPacket = PACKET_TYPE_ERROR;
                                result = MU_FAILURE;
                            }
                            break;

                        case PUBLISH_TYPE:
                        case CONTROL_PACKET_TYPE_INVALID: 
                        case PACKET_TYPE_ERROR:
                        case UNKNOWN_TYPE:
                            break;
                    }
                }
                else
                {
                    if (prepareheaderDataInfo(codec_Data, iterator) != 0)
                    {
                        /* Codes_SRS_MQTT_CODEC_07_035: [If any error is encountered then the packet state will be marked as error and mqtt_codec_bytesReceived shall return a non-zero value.] */
                        codec_Data->currPacket = PACKET_TYPE_ERROR;
                        result = MU_FAILURE;
                    }
                    else if (codec_Data->currPacket == PINGRESP_TYPE)
                    {
                        // PINGRESP must not have a payload
                        if (((int8_t*)buffer)[index] == 0)
                        {
                            /* Codes_SRS_MQTT_CODEC_07_034: [Upon a constructing a complete MQTT packet mqtt_codec_bytesReceived shall call the ON_PACKET_COMPLETE_CALLBACK function.] */
                            completePacketData(codec_Data);
                        }
                        else
                        {
                            codec_Data->currPacket = PACKET_TYPE_ERROR;
                            result = MU_FAILURE;
                        }
                    }
                }
            }
            else if (codec_Data->codecState == CODEC_STATE_VAR_HEADER)
            {
                if (codec_Data->headerData == NULL)
                {
                    codec_Data->codecState = CODEC_STATE_PAYLOAD;
                }
                else
                {
                    uint8_t* dataBytes = BUFFER_u_char(codec_Data->headerData);
                    if (dataBytes == NULL)
                    {
                        /* Codes_SRS_MQTT_CODEC_07_035: [If any error is encountered then the packet state will be marked as error and mqtt_codec_bytesReceived shall return a non-zero value.] */
                        codec_Data->currPacket = PACKET_TYPE_ERROR;
                        result = MU_FAILURE;
                    }
                    else
                    {
                        // Increment the data
                        dataBytes += codec_Data->bufferOffset++;
                        *dataBytes = iterator;

                        size_t totalLen = BUFFER_length(codec_Data->headerData);
                        if (codec_Data->bufferOffset >= totalLen)
                        {
                            /* Codes_SRS_MQTT_CODEC_07_034: [Upon a constructing a complete MQTT packet mqtt_codec_bytesReceived shall call the ON_PACKET_COMPLETE_CALLBACK function.] */
                            completePacketData(codec_Data);
                        }
                    }
                }
            }
            else
            {
                /* Codes_SRS_MQTT_CODEC_07_035: [If any error is encountered then the packet state will be marked as error and mqtt_codec_bytesReceived shall return a non-zero value.] */
                codec_Data->currPacket = PACKET_TYPE_ERROR;
                result = MU_FAILURE;
            }
        }
    }
    return result;
}